

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdGetTxInfo(void *handle,int net_type,char *tx_hex_string,char **txid,char **wtxid,
                uint32_t *size,uint32_t *vsize,uint32_t *weight,uint32_t *version,uint32_t *locktime
                )

{
  bool bVar1;
  CfdException *this;
  allocator local_142;
  bool is_bitcoin;
  char *work_wtxid;
  char *work_txid;
  void *local_130;
  string local_128;
  TransactionContext tx;
  
  work_txid = (char *)0x0;
  work_wtxid = (char *)0x0;
  local_130 = handle;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    is_bitcoin = false;
    cfd::capi::ConvertNetType(net_type,&is_bitcoin);
    if (is_bitcoin == true) {
      std::__cxx11::string::string((string *)&local_128,tx_hex_string,&local_142);
      cfd::TransactionContext::TransactionContext(&tx,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      cfd::capi::GetTxInfo
                ((AbstractTransaction *)&tx,&work_txid,&work_wtxid,size,vsize,weight,version,
                 locktime);
      cfd::TransactionContext::~TransactionContext(&tx);
    }
    else {
      std::__cxx11::string::string((string *)&local_128,tx_hex_string,&local_142);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&tx,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      cfd::capi::GetTxInfo
                ((AbstractTransaction *)&tx,&work_txid,&work_wtxid,size,vsize,weight,version,
                 locktime);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&tx);
    }
    if (work_txid != (char *)0x0) {
      *txid = work_txid;
    }
    if (work_wtxid != (char *)0x0) {
      *wtxid = work_wtxid;
    }
    return 0;
  }
  tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x6217ab;
  tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x99f;
  tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_d6b07b;
  cfd::core::logger::log<>((CfdSourceLocation *)&tx,kCfdLogLevelWarning,"tx is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)&tx.super_Transaction.vin_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tx,"Failed to parameter. tx is null or empty.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&tx);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInfo(
    void* handle, int net_type, const char* tx_hex_string, char** txid,
    char** wtxid, uint32_t* size, uint32_t* vsize, uint32_t* weight,
    uint32_t* version, uint32_t* locktime) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_txid = nullptr;
  char* work_wtxid = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      GetTxInfo(
          &tx, &work_txid, &work_wtxid, size, vsize, weight, version,
          locktime);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      GetTxInfo(
          &tx, &work_txid, &work_wtxid, size, vsize, weight, version,
          locktime);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (work_txid != nullptr) *txid = work_txid;
    if (work_wtxid != nullptr) *wtxid = work_wtxid;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_txid, &work_wtxid);
  return result;
}